

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portioner.cpp
# Opt level: O2

vector<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>
* __thiscall
Portioner::get_bucket_cluster
          (vector<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>
           *__return_storage_ptr__,Portioner *this,Point_d *point_in_bucket)

{
  int iVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  int j;
  long lVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  
  (__return_storage_ptr__->
  super__Vector_base<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar1 = this->_X_Bucketsize;
  iVar2 = (int)(point_in_bucket->x - (double)((int)point_in_bucket->x % iVar1)) / iVar1;
  iVar4 = this->_Y_Bucketsize;
  iVar6 = (int)(point_in_bucket->y - (double)((int)point_in_bucket->y % iVar4)) / iVar4;
  iVar7 = this->_width / iVar1 + -1;
  iVar1 = this->_height / iVar4 + -1;
  if ((((iVar6 == 0) || (iVar6 == iVar1)) || (iVar2 == 0)) || (iVar2 == iVar7)) {
    iVar4 = iVar6 + 1;
    if (iVar6 == iVar1) {
      iVar4 = iVar6;
    }
    iVar1 = iVar6 + -1;
    if (iVar6 == 0) {
      iVar1 = 0;
    }
    iVar6 = iVar2 + 1;
    if (iVar2 == iVar7) {
      iVar6 = iVar2;
    }
    iVar7 = iVar2 + -1;
    if (iVar2 == 0) {
      iVar7 = 0;
    }
    for (lVar3 = (long)iVar7; lVar5 = (long)iVar1, lVar8 = (long)iVar1 * 0x18, lVar3 <= iVar6;
        lVar3 = lVar3 + 1) {
      for (; lVar5 <= iVar4; lVar5 = lVar5 + 1) {
        std::
        vector<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>
        ::push_back(__return_storage_ptr__,
                    (value_type *)
                    (*(long *)&(this->_point_buckets_fast).
                               super__Vector_base<std::vector<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>,_std::allocator<std::vector<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[lVar3].
                               super__Vector_base<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>
                               ._M_impl.super__Vector_impl_data + lVar8));
        lVar8 = lVar8 + 0x18;
      }
    }
  }
  else {
    for (lVar3 = (long)(iVar2 + -1); lVar5 = (long)(iVar6 + -1), lVar8 = (long)(iVar6 + -1) * 0x18,
        lVar3 <= iVar2 + 1; lVar3 = lVar3 + 1) {
      for (; lVar5 <= iVar6 + 1; lVar5 = lVar5 + 1) {
        std::
        vector<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>
        ::push_back(__return_storage_ptr__,
                    (value_type *)
                    (*(long *)&(this->_point_buckets_fast).
                               super__Vector_base<std::vector<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>,_std::allocator<std::vector<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[lVar3].
                               super__Vector_base<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>
                               ._M_impl.super__Vector_impl_data + lVar8));
        lVar8 = lVar8 + 0x18;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::vector<Point_d>>Portioner::get_bucket_cluster(Point_d const& point_in_bucket)
{
  std::vector<std::vector<Point_d>>point_cluster;

  long minusvalue = ((int)point_in_bucket.x%_X_Bucketsize);
  int bucket_collumn = (int)(point_in_bucket.x-minusvalue)/_X_Bucketsize;
/*
DEBUG
  std::cout<<"bucket column "<< bucket_collumn<<"\n";
  if (bucket_collumn > max_bucket_collumn){
    max_bucket_collumn = bucket_collumn;
  }
*/
  minusvalue = (int)point_in_bucket.y%_Y_Bucketsize;
  int bucket_row = (int)(point_in_bucket.y-minusvalue)/_Y_Bucketsize;

  bool  top = false;
  bool  bottom = false;
  bool  left = false;
  bool  right = false;

  int from_x, till_x, from_y, till_y;


  if(bucket_collumn == 0) {
    left = true;
    from_x = bucket_collumn;
  }
  else{
    from_x = bucket_collumn-1;
  }
  if(bucket_collumn == (_width/_X_Bucketsize-1)) {
    right = true;
    till_x = bucket_collumn;
  }
  else{
    till_x = bucket_collumn+1;
  }
  if(bucket_row == 0) {
    top = true;
    from_y = bucket_row;
  }
  else{
    from_y = bucket_row-1;
  }
  if(bucket_row == (_height/_Y_Bucketsize-1)) {
    bottom = true;
    till_y = bucket_row;

  }
  else{
    till_y = bucket_row+1;
  }
  //if point is in a bucket which is not on border of buckets
  if(top==false && bottom==false && left==false && right==false){
      for(int i = bucket_collumn-1; i<=bucket_collumn+1; i++){
        for(int j = bucket_row-1; j<= bucket_row+1; j++){
          point_cluster.push_back(_point_buckets_fast[i][j]);
        }
      }
    }

  else{ for(int i = from_x; i<=till_x; i++){
          for(int j = from_y; j<= till_y; j++){
            point_cluster.push_back(_point_buckets_fast[i][j]);
          }
        }
      }

  return point_cluster;
}